

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_perf_strided.c
# Opt level: O1

void grid_factor(int p,int *idx,int *idy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  int fac [256];
  int prime [256];
  int aiStack_840 [258];
  int aiStack_438 [258];
  
  aiStack_840[1] = p;
  dVar9 = (double)p;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  iVar7 = 0;
  uVar5 = 0;
  if (0 < (int)dVar9) {
    uVar5 = 0;
    iVar2 = 2;
    do {
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          if (iVar2 % aiStack_438[uVar6] == 0) goto LAB_00103c3d;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (0xff < (int)uVar5) {
        puts("Overflow in grid_factor");
      }
      lVar3 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      aiStack_438[lVar3] = iVar2;
LAB_00103c3d:
      bVar8 = iVar2 != (int)dVar9 + 1;
      iVar2 = iVar2 + 1;
    } while (bVar8);
  }
  if (0 < (int)uVar5) {
    uVar6 = 0;
    iVar7 = 0;
    iVar2 = aiStack_840[1];
    do {
      iVar1 = aiStack_438[uVar6];
      if (iVar2 % iVar1 == 0) {
        piVar4 = aiStack_840 + (long)iVar7 + 2;
        do {
          *piVar4 = iVar1;
          lVar3 = (long)iVar2;
          iVar2 = (int)(lVar3 / (long)iVar1);
          piVar4 = piVar4 + 1;
          iVar7 = iVar7 + 1;
        } while ((int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 |
                             lVar3 / (long)iVar1 & 0xffffffffU) % (long)iVar1) == 0);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  iVar2 = iVar7;
  if (iVar7 == 0) {
    aiStack_840[2] = aiStack_840[1];
    iVar2 = 1;
  }
  *idx = 1;
  *idy = 1;
  if (0 < iVar2) {
    lVar3 = (ulong)(iVar7 + (uint)(iVar7 == 0)) + 1;
    do {
      iVar7 = *idx;
      iVar2 = *idy;
      iVar1 = iVar2;
      if (iVar7 < iVar2) {
        iVar1 = iVar7;
      }
      piVar4 = idx;
      if (iVar2 < iVar7) {
        piVar4 = idy;
      }
      *piVar4 = iVar1 * aiStack_840[lVar3];
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

void grid_factor(int p, int *idx, int *idy) {
  int i, j; 
  int ip, ifac, pmax, prime[MAX_FACTOR];
  int fac[MAX_FACTOR];
  int ix, iy, ichk;

  i = 1;
/**
 *   factor p completely
 *   first, find all prime numbers, besides 1, less than or equal to 
 *   the square root of p
 */
  ip = (int)(sqrt((double)p))+1;
  pmax = 0;
  for (i=2; i<=ip; i++) {
    ichk = 1;
    for (j=0; j<pmax; j++) {
      if (i%prime[j] == 0) {
        ichk = 0;
        break;
      }
    }
    if (ichk) {
      pmax = pmax + 1;
      if (pmax > MAX_FACTOR) printf("Overflow in grid_factor\n");
      prime[pmax-1] = i;
    }
  }
/**
 *   find all prime factors of p
 */
  ip = p;
  ifac = 0;
  for (i=0; i<pmax; i++) {
    while(ip%prime[i] == 0) {
      ifac = ifac + 1;
      fac[ifac-1] = prime[i];
      ip = ip/prime[i];
    }
  }
/**
 *  p is prime
 */
  if (ifac==0) {
    ifac++;
    fac[0] = p;
  }
/**
 *    find two factors of p of approximately the
 *    same size
 */
  *idx = 1;
  *idy = 1;
  for (i = ifac-1; i >= 0; i--) {
    ix = *idx;
    iy = *idy;
    if (ix <= iy) {
      *idx = fac[i]*(*idx);
    } else {
      *idy = fac[i]*(*idy);
    }
  }
}